

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void asmjit::CodeHolder_resetInternal(CodeHolder *self,bool releaseMemory)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  while (self->_emitters != (CodeEmitter *)0x0) {
    CodeHolder::detach(self,self->_emitters);
  }
  (self->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (self->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (self->_codeInfo)._baseAddress = 0xffffffffffffffff;
  self->_globalHints = 0;
  self->_globalOptions = 0;
  self->_unresolvedLabelsCount = 0;
  self->_trampolinesSize = 0;
  uVar3 = 0;
  self->_logger = (Logger *)0x0;
  self->_errorHandler = (ErrorHandler *)0x0;
  sVar1 = (self->_sections).super_ZoneVectorBase._length;
  while( true ) {
    if (sVar1 == uVar3) {
      ZoneHashBase::reset(&(self->_namedLabels).super_ZoneHashBase,&self->_baseHeap);
      (self->_relocations).super_ZoneVectorBase._capacity = 0;
      (self->_sections).super_ZoneVectorBase._data = (void *)0x0;
      (self->_sections).super_ZoneVectorBase._length = 0;
      (self->_sections).super_ZoneVectorBase._capacity = 0;
      (self->_labels).super_ZoneVectorBase._data = (void *)0x0;
      (self->_labels).super_ZoneVectorBase._length = 0;
      (self->_labels).super_ZoneVectorBase._capacity = 0;
      (self->_relocations).super_ZoneVectorBase._data = (void *)0x0;
      (self->_relocations).super_ZoneVectorBase._length = 0;
      ZoneHeap::reset(&self->_baseHeap,&self->_baseZone);
      Zone::reset(&self->_baseZone,releaseMemory);
      return;
    }
    if ((self->_sections).super_ZoneVectorBase._length <= uVar3) break;
    lVar2 = *(long *)((long)(self->_sections).super_ZoneVectorBase._data + uVar3 * 8);
    if ((*(void **)(lVar2 + 0x38) != (void *)0x0) && (*(char *)(lVar2 + 0x50) == '\0')) {
      free(*(void **)(lVar2 + 0x38));
    }
    *(undefined8 *)(lVar2 + 0x38) = 0;
    *(undefined8 *)(lVar2 + 0x48) = 0;
    uVar3 = uVar3 + 1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
             ,0x31b,"i < _length");
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, bool releaseMemory) noexcept {
  // Detach all `CodeEmitter`s.
  while (self->_emitters)
    self->detach(self->_emitters);

  // Reset everything into its construction state.
  self->_codeInfo.reset();
  self->_globalHints = 0;
  self->_globalOptions = 0;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  self->_unresolvedLabelsCount = 0;
  self->_trampolinesSize = 0;

  // Reset all sections.
  size_t numSections = self->_sections.getLength();
  for (size_t i = 0; i < numSections; i++) {
    SectionEntry* section = self->_sections[i];
    if (section->_buffer.hasData() && !section->_buffer.isExternal())
      Internal::releaseMemory(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneHeap* heap = &self->_baseHeap;

  self->_namedLabels.reset(heap);
  self->_relocations.reset();
  self->_labels.reset();
  self->_sections.reset();

  heap->reset(&self->_baseZone);
  self->_baseZone.reset(releaseMemory);
}